

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

ScriptWitness * GetExpectWitnessStack(void)

{
  ScriptWitness *in_RDI;
  allocator local_49;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  string local_30;
  
  in_RDI->_vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_005ba128;
  (in_RDI->witness_stack_).
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->witness_stack_).
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->witness_stack_).
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&local_30,
             "3044022075282f574650e20c3a87d0d1f67d0bcd8f9319b26d244eb254c0aa5bc0284e8002205bddfd4e2f5e278de5f473804a1d061ed6f9bdbcb65fec9b20402879c5a9980901"
             ,&local_49);
  cfd::core::ByteData::ByteData((ByteData *)&local_48,&local_30);
  cfd::core::ScriptWitness::AddWitnessStack(in_RDI,(ByteData *)&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string
            ((string *)&local_30,
             "025c36c65910268ee06421053cb9bab1c849c4bdd467d6e77a89d33ff213adc3ca",&local_49);
  cfd::core::ByteData::ByteData((ByteData *)&local_48,&local_30);
  cfd::core::ScriptWitness::AddWitnessStack(in_RDI,(ByteData *)&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

static ScriptWitness GetExpectWitnessStack() {
  ScriptWitness exp_witness_stack;
  exp_witness_stack.AddWitnessStack(ByteData("3044022075282f574650e20c3a87d0d1f67d0bcd8f9319b26d244eb254c0aa5bc0284e8002205bddfd4e2f5e278de5f473804a1d061ed6f9bdbcb65fec9b20402879c5a9980901"));
  exp_witness_stack.AddWitnessStack(ByteData("025c36c65910268ee06421053cb9bab1c849c4bdd467d6e77a89d33ff213adc3ca"));
  return exp_witness_stack;
}